

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QJsonValue *
qt_convertToJson(QJsonValue *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                ConversionMode mode)

{
  Type TVar1;
  Element *pEVar2;
  Element *pEVar3;
  QCborContainerPrivate *pQVar4;
  ByteData *this;
  bool b;
  Type type;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QByteArrayView input;
  QUrl QStack_58;
  QArrayDataPointer<char16_t> local_50;
  Data *local_38;
  QCborContainerPrivate *pQStack_30;
  Data *local_28;
  char *local_20;
  
  local_20 = *(char **)(in_FS_OFFSET + 0x28);
  do {
    if (idx == -0xa0) {
      convertToJsonObject((QCborContainerPrivate *)&stack0xffffffffffffffc8,(ConversionMode)d);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonObject *)&stack0xffffffffffffffc8);
      QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffffc8);
LAB_002bf9cd:
      if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
LAB_002bfa8e:
      __stack_chk_fail();
    }
    if (idx == -0x80) {
      convertToJsonArray((QCborContainerPrivate *)&stack0xffffffffffffffc8,(ConversionMode)d);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonArray *)&stack0xffffffffffffffc8);
      QJsonArray::~QJsonArray((QJsonArray *)&stack0xffffffffffffffc8);
      goto LAB_002bf9cd;
    }
    if (idx < 0) {
      if ((d == (QCborContainerPrivate *)0x0) || ((d->elements).d.size != 2)) {
        if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
          type = Undefined;
          goto LAB_002bf8d8;
        }
        goto LAB_002bfa8e;
      }
      pEVar3 = (d->elements).d.ptr;
      pQVar4 = (pEVar3->field_0).container;
      if (pQVar4 < (QCborContainerPrivate *)0x26) {
        if ((0x2000e00001U >> ((ulong)pQVar4 & 0x3f) & 1) == 0) {
          if (pQVar4 != (QCborContainerPrivate *)0x20) goto LAB_002bf92a;
          if (pEVar3[1].type == String) {
            this = QCborContainerPrivate::byteData(d,1);
            QtCbor::ByteData::asByteArrayView((QByteArray *)&local_50,this);
            input.m_data = (storage_type *)local_50.size;
            input.m_size = (qsizetype)&QStack_58;
            QUrl::fromEncoded(input,(ParsingMode)local_50.ptr);
            QUrl::toString((QString *)&stack0xffffffffffffffc8,&QStack_58,
                           (FormattingOptions)0x1f00000);
            QJsonValue::QJsonValue(__return_storage_ptr__,(QString *)&stack0xffffffffffffffc8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc8);
            QUrl::~QUrl(&QStack_58);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_50);
            goto LAB_002bf9cd;
          }
        }
        local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_30 = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        maybeEncodeTag((QString *)&stack0xffffffffffffffc8,d);
        if (pQStack_30 != (QCborContainerPrivate *)0x0) {
          QJsonValue::QJsonValue(__return_storage_ptr__,(QString *)&stack0xffffffffffffffc8);
LAB_002bf9c3:
          this_00 = (QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc8;
          goto LAB_002bf9c8;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc8);
      }
LAB_002bf92a:
      qt_convertToJson(__return_storage_ptr__,d,1,FromRaw);
      goto LAB_002bf9cd;
    }
    pEVar2 = (d->elements).d.ptr;
    pEVar3 = pEVar2 + idx;
    TVar1 = pEVar2[idx].type;
    if ((((((long)TVar1 != 0x80) && (TVar1 != Map)) && (TVar1 != Tag)) &&
        ((TVar1 != DateTime && (TVar1 != Url)))) && (TVar1 != Uuid)) {
      if (((uint)(TVar1 + ~True) < 2) || (TVar1 == Invalid)) {
LAB_002bf8bf:
        if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
          type = Null;
LAB_002bf8d8:
          QJsonValue::QJsonValue(__return_storage_ptr__,type);
          return __return_storage_ptr__;
        }
        goto LAB_002bfa8e;
      }
      if (TVar1 == RegularExpression) {
        if (mode == FromVariantToJson) goto LAB_002bf8bf;
      }
      else if (TVar1 == ByteArray) {
        if (mode == FromVariantToJson) {
          local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_30 = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          makeString((QString *)&stack0xffffffffffffffc8,d,idx,FromVariantToJson);
          if (local_28 == (Data *)0x0) {
            QJsonValue::QJsonValue(__return_storage_ptr__,Null);
          }
          else {
            QCborValue::QCborValue((QCborValue *)&local_50,(QString *)&stack0xffffffffffffffc8);
            QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,(QCborValue *)&local_50);
            QCborValue::~QCborValue((QCborValue *)&local_50);
          }
          goto LAB_002bf9c3;
        }
      }
      else {
        if (TVar1 == False) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            b = false;
LAB_002bf845:
            QJsonValue::QJsonValue(__return_storage_ptr__,b);
            return __return_storage_ptr__;
          }
          goto LAB_002bfa8e;
        }
        if (TVar1 == True) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            b = true;
            goto LAB_002bf845;
          }
          goto LAB_002bfa8e;
        }
        if (TVar1 == Double) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            fpToJson(__return_storage_ptr__,(double)pEVar3->field_0);
            return __return_storage_ptr__;
          }
          goto LAB_002bfa8e;
        }
        if (TVar1 == Integer) {
          if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
            QJsonValue::QJsonValue(__return_storage_ptr__,(pEVar3->field_0).value);
            return __return_storage_ptr__;
          }
          goto LAB_002bfa8e;
        }
      }
      makeString((QString *)&local_50,d,idx,mode);
      QCborValue::QCborValue((QCborValue *)&stack0xffffffffffffffc8,(QString *)&local_50);
      QJsonPrivate::Value::fromTrustedCbor
                (__return_storage_ptr__,(QCborValue *)&stack0xffffffffffffffc8);
      QCborValue::~QCborValue((QCborValue *)&stack0xffffffffffffffc8);
      this_00 = &local_50;
LAB_002bf9c8:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      goto LAB_002bf9cd;
    }
    if (((pEVar3->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) == 0) {
      d = (QCborContainerPrivate *)0x0;
    }
    else {
      d = (pEVar3->field_0).container;
    }
    idx = -(long)TVar1;
  } while( true );
}

Assistant:

QJsonValue qt_convertToJson(QCborContainerPrivate *d, qsizetype idx, ConversionMode mode)
{
    // encoding the container itself
    if (idx == -QCborValue::Array)
        return convertToJsonArray(d, mode);
    if (idx == -QCborValue::Map)
        return convertToJsonObject(d, mode);
    if (idx < 0) {
        // tag-like type
        if (!d || d->elements.size() != 2)
            return QJsonValue::Undefined;   // invalid state
        return convertExtendedTypeToJson(d);
    }

    // an element in the container
    const auto &e = d->elements.at(idx);
    switch (e.type) {
    case QCborValue::Integer:
        return QJsonValue(e.value);
    case QCborValue::ByteArray:
        if (mode == ConversionMode::FromVariantToJson) {
            const auto value = makeString(d, idx, mode);
            return value.isEmpty() ? QJsonValue() : QJsonPrivate::Value::fromTrustedCbor(value);
        }
        break;
    case QCborValue::RegularExpression:
        if (mode == ConversionMode::FromVariantToJson)
            return QJsonValue();
        break;
    case QCborValue::String:
    case QCborValue::SimpleType:
        // make string
        break;

    case QCborValue::Array:
    case QCborValue::Map:
    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::Uuid:
        // recurse
        return qt_convertToJson(e.flags & Element::IsContainer ? e.container : nullptr, -e.type,
                                mode);

    case QCborValue::Null:
    case QCborValue::Undefined:
    case QCborValue::Invalid:
        return QJsonValue();

    case QCborValue::False:
        return false;

    case QCborValue::True:
        return true;

    case QCborValue::Double:
        return fpToJson(e.fpvalue());
    }

    return QJsonPrivate::Value::fromTrustedCbor(makeString(d, idx, mode));
}